

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O0

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CByIndexExpression *exp)

{
  initializer_list<INode_*> __l;
  allocator local_101;
  string local_100 [32];
  ChildrenAnswers local_e0;
  vector<INode_*,_std::allocator<INode_*>_> local_b0;
  undefined1 local_98 [8];
  ChildrenAnswers answers;
  allocator<INode_*> local_51;
  pointer local_50;
  pointer local_48;
  pointer *local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<INode_*,_std::allocator<INode_*>_> children;
  CByIndexExpression *exp_local;
  CPrintVisitor *this_local;
  
  children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)exp;
  local_50 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::get(&exp->identifier);
  local_48 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::get
                       ((unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
  local_40 = &local_50;
  local_38 = 2;
  std::allocator<INode_*>::allocator(&local_51);
  __l._M_len = local_38;
  __l._M_array = (iterator)local_40;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30,__l,&local_51);
  std::allocator<INode_*>::~allocator(&local_51);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            (&local_b0,(vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  VisitChildren((ChildrenAnswers *)local_98,this,&local_b0);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector(&local_b0);
  ChildrenAnswers::ChildrenAnswers(&local_e0,(ChildrenAnswers *)local_98);
  AddChildrenAnswers(this,(ChildrenAnswers *)&local_e0);
  ChildrenAnswers::~ChildrenAnswers(&local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"ElementByIndex",&local_101);
  AddLabel(this,(string *)local_100);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)local_98);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  return;
}

Assistant:

void CPrintVisitor::Visit(CByIndexExpression &exp)
{
	std::vector<INode*> children = { exp.identifier.get(), exp.indexExpression.get() };
	ChildrenAnswers answers = VisitChildren(children);
	AddChildrenAnswers(answers);
	AddLabel("ElementByIndex");
	++lastVisited;	
}